

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O3

void __thiscall UKF::ProcessMeasurement(UKF *this,MeasurementPackage *meas_package)

{
  long lVar1;
  long lVar2;
  DenseIndex DVar3;
  ulong uVar4;
  double *pdVar5;
  double dVar6;
  Index index;
  undefined8 *puVar7;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar8;
  ulong uVar9;
  ostream *poVar10;
  ulong uVar11;
  Index size;
  VectorXd *this_00;
  float fVar12;
  float fVar13;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_a8;
  float local_84;
  MeasurementPackage local_80;
  MeasurementPackage local_60;
  Scalar local_40;
  Scalar local_38;
  Scalar local_30;
  Scalar local_28;
  
  lVar1 = meas_package->timestamp_;
  if (this->is_initialized_ == false) {
    this->time_us_ = lVar1;
    if (meas_package->sensor_type_ != LASER) {
      if (meas_package->sensor_type_ == RADAR) {
        lVar1 = (meas_package->raw_measurements_).
                super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
        if ((lVar1 < 1) || (lVar1 == 1)) goto LAB_001040e6;
        pdVar5 = (meas_package->raw_measurements_).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        fVar12 = (float)*pdVar5;
        local_84 = (float)pdVar5[1];
        fVar13 = cosf(local_84);
        local_a8.m_row = 0;
        local_a8.m_col = 1;
        local_a8.m_currentBlockRows = 1;
        *(this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
             = (double)(fVar13 * fVar12);
        local_a8.m_xpr = &this->x_;
        fVar13 = sinf(local_84);
        local_30 = (Scalar)(fVar13 * fVar12);
        pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                           (&local_a8,&local_30);
        local_38 = 0.0;
        pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                           (pCVar8,&local_38);
        local_40 = 0.0;
        pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                           (pCVar8,&local_40);
        local_28 = 0.0;
        Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                  (pCVar8,&local_28);
        if ((local_a8.m_currentBlockRows + local_a8.m_row !=
             ((local_a8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
             m_storage.m_rows) || (local_a8.m_col != 1)) goto LAB_00104143;
      }
LAB_00103f3e:
      this->is_initialized_ = true;
      return;
    }
    lVar1 = (meas_package->raw_measurements_).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    if (0 < lVar1) {
      local_a8.m_xpr = &this->x_;
      pdVar5 = (meas_package->raw_measurements_).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      local_a8.m_row = 0;
      local_a8.m_col = 1;
      local_a8.m_currentBlockRows = 1;
      *(this->x_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           *pdVar5;
      if (lVar1 != 1) {
        pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                           (&local_a8,pdVar5 + 1);
        local_30 = 0.0;
        pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                           (pCVar8,&local_30);
        local_38 = 0.0;
        pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                           (pCVar8,&local_38);
        local_40 = 0.0;
        Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                  (pCVar8,&local_40);
        if ((local_a8.m_currentBlockRows + local_a8.m_row ==
             ((local_a8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
             m_storage.m_rows) && (local_a8.m_col == 1)) {
          lVar1 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows;
          if ((0 < lVar1) &&
             (lVar2 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_cols, 0 < lVar2)) {
            pdVar5 = (this->P_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_data;
            *pdVar5 = 0.5;
            if ((lVar1 != 1) && (lVar2 != 1)) {
              pdVar5[lVar1 + 1] = 0.5;
              goto LAB_00103f3e;
            }
          }
          __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x151,
                        "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                       );
        }
LAB_00104143:
        __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/CommaInitializer.h"
                      ,0x6f,
                      "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
                     );
      }
    }
LAB_001040e6:
    __assert_fail("index >= 0 && index < size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/DenseCoeffsBase.h"
                  ,0x17a,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
  lVar2 = this->time_us_;
  this->time_us_ = lVar1;
  for (dVar6 = (double)(lVar1 - lVar2) / 1000000.0; 0.1 < dVar6; dVar6 = dVar6 + -0.05) {
    Prediction(this,0.05);
  }
  Prediction(this,dVar6);
  if (meas_package->sensor_type_ == LASER) {
    local_80.sensor_type_ = meas_package->sensor_type_;
    this_00 = &local_80.raw_measurements_;
    local_80.timestamp_ = meas_package->timestamp_;
    DVar3 = (meas_package->raw_measurements_).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)this_00,DVar3,DVar3,1);
    uVar4 = (meas_package->raw_measurements_).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    if ((long)uVar4 < 0) {
LAB_00104124:
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/PlainObjectBase.h"
                    ,0xf1,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                   );
    }
    if (local_80.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        m_storage.m_rows != uVar4) {
      free(local_80.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
           .m_storage.m_data);
      if (uVar4 == 0) {
        local_80.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        m_storage.m_data = (double *)0x0;
      }
      else if ((uVar4 >> 0x3d != 0) ||
              (local_80.raw_measurements_.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
                    (double *)malloc(uVar4 * 8),
              local_80.raw_measurements_.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data ==
              (double *)0x0)) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar7 = operator_delete;
        __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      local_80.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_rows = uVar4;
      if (uVar4 != (meas_package->raw_measurements_).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
      {
LAB_00104162:
        __assert_fail("rows() == other.rows() && cols() == other.cols()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/preritj[P]Unscented-Kalman-Filter/src/Eigen/src/Core/Assign.h"
                      ,0x1f9,
                      "Derived &Eigen::DenseBase<Eigen::Matrix<double, -1, 1>>::lazyAssign(const DenseBase<OtherDerived> &) [Derived = Eigen::Matrix<double, -1, 1>, OtherDerived = Eigen::Matrix<double, -1, 1>]"
                     );
      }
    }
    uVar9 = uVar4 & 0x7ffffffffffffffe;
    if (1 < uVar4) {
      uVar11 = 0;
      do {
        pdVar5 = (meas_package->raw_measurements_).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                 uVar11;
        dVar6 = pdVar5[1];
        local_80.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        m_storage.m_data[uVar11] = *pdVar5;
        (local_80.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
         m_storage.m_data + uVar11)[1] = dVar6;
        uVar11 = uVar11 + 2;
      } while (uVar11 < uVar9);
    }
    if ((long)uVar9 < (long)uVar4) {
      pdVar5 = (meas_package->raw_measurements_).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      do {
        local_80.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        m_storage.m_data[uVar9] = pdVar5[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar4 != uVar9);
    }
    UpdateLidar(this,&local_80);
  }
  else {
    if (meas_package->sensor_type_ != RADAR) goto LAB_00104039;
    local_60.sensor_type_ = meas_package->sensor_type_;
    this_00 = &local_60.raw_measurements_;
    local_60.timestamp_ = meas_package->timestamp_;
    DVar3 = (meas_package->raw_measurements_).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)this_00,DVar3,DVar3,1);
    uVar4 = (meas_package->raw_measurements_).
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    if ((long)uVar4 < 0) goto LAB_00104124;
    if (local_60.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        m_storage.m_rows != uVar4) {
      free(local_60.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
           .m_storage.m_data);
      if (uVar4 == 0) {
        local_60.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        m_storage.m_data = (double *)0x0;
      }
      else if ((uVar4 >> 0x3d != 0) ||
              (local_60.raw_measurements_.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
                    (double *)malloc(uVar4 * 8),
              local_60.raw_measurements_.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data ==
              (double *)0x0)) {
        puVar7 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar7 = operator_delete;
        __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
      local_60.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
      m_storage.m_rows = uVar4;
      if (uVar4 != (meas_package->raw_measurements_).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
      goto LAB_00104162;
    }
    uVar9 = uVar4 & 0x7ffffffffffffffe;
    if (1 < uVar4) {
      uVar11 = 0;
      do {
        pdVar5 = (meas_package->raw_measurements_).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                 uVar11;
        dVar6 = pdVar5[1];
        local_60.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        m_storage.m_data[uVar11] = *pdVar5;
        (local_60.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
         m_storage.m_data + uVar11)[1] = dVar6;
        uVar11 = uVar11 + 2;
      } while (uVar11 < uVar9);
    }
    if ((long)uVar9 < (long)uVar4) {
      pdVar5 = (meas_package->raw_measurements_).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      do {
        local_60.raw_measurements_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
        m_storage.m_data[uVar9] = pdVar5[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar4 != uVar9);
    }
    UpdateRadar(this,&local_60);
  }
  free((this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data);
LAB_00104039:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x_ = ",5);
  poVar10 = Eigen::operator<<((ostream *)&std::cout,
                              (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->x_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P_ = ",5);
  poVar10 = Eigen::operator<<((ostream *)&std::cout,
                              (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->P_);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  return;
}

Assistant:

void UKF::ProcessMeasurement(MeasurementPackage meas_package) {
  /**
  TODO:

  Complete this function! Make sure you switch between lidar and radar
  measurements.
  */

  if (!is_initialized_){
    time_us_ = meas_package.timestamp_;
    if (meas_package.sensor_type_ == MeasurementPackage::RADAR){
      float rho = meas_package.raw_measurements_[0];
      float phi = meas_package.raw_measurements_[1];
      x_ << rho*cos(phi), rho*sin(phi), 0, 0, 0;
    }
    else if (meas_package.sensor_type_ == MeasurementPackage::LASER){
      x_ << meas_package.raw_measurements_[0],
            meas_package.raw_measurements_[1],
            0, 0, 0;
      // use smaller variance for lidar
      P_(0,0) = 0.5;
      P_(1,1) = 0.5;
    }
    is_initialized_ = true;
    return;
  }

  //compute the time elapsed between the current and previous measurements
  double dt = (double)(meas_package.timestamp_ - time_us_) / 1000000.0;	//dt - expressed in seconds
  time_us_ = meas_package.timestamp_;

  // predict state vector

  // for large time intervals (dataset-2), Eulers approx for integration fails
  // one solution is to use smaller time intervals
  while(dt > 0.1){
    const double dt_eps = 0.05;
    Prediction(dt_eps);
    dt -= dt_eps;
  }
  Prediction(dt);

  // update state vector
  if (meas_package.sensor_type_ == MeasurementPackage::RADAR){
    UpdateRadar(meas_package);
  }
  else if (meas_package.sensor_type_ == MeasurementPackage::LASER){
    UpdateLidar(meas_package);
  }

  // print the output
  cout << "x_ = " << x_ << endl;
  cout << "P_ = " << P_ << endl;
}